

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

void IDisk::FillTrack(uchar *track_buffer,uchar cylinder,DiskType type,uint sizeOftrack)

{
  unsigned_short uVar1;
  uint uVar2;
  int iVar3;
  uint local_74;
  uchar local_6e;
  uchar uStack_6d;
  uint k;
  unsigned_short computed_crc;
  undefined1 local_60 [8];
  CRC crc;
  uchar *puStack_30;
  uint s;
  uchar *chrns;
  int local_20;
  int load_disk_index;
  int j;
  uint sizeOftrack_local;
  DiskType type_local;
  uchar cylinder_local;
  uchar *track_buffer_local;
  
  chrns._4_4_ = 0;
  if (type == VENDOR) {
    puStack_30 = vendor_track;
  }
  else {
    puStack_30 = data_track;
  }
  for (local_20 = 0; local_20 < 0x50; local_20 = local_20 + 1) {
    chrns._4_4_ = AddByteToTrack(track_buffer,chrns._4_4_,'N',8,'\0');
  }
  for (local_20 = 0; local_20 < 0xc; local_20 = local_20 + 1) {
    chrns._4_4_ = AddByteToTrack(track_buffer,chrns._4_4_,'\0',8,'\0');
  }
  uVar2 = AddSyncByteToTrack(track_buffer,chrns._4_4_,0xc2);
  uVar2 = AddSyncByteToTrack(track_buffer,uVar2,0xc2);
  uVar2 = AddSyncByteToTrack(track_buffer,uVar2,0xc2);
  chrns._4_4_ = AddByteToTrack(track_buffer,uVar2,0xfc,8,'\0');
  for (local_20 = 0; local_20 < 0x32; local_20 = local_20 + 1) {
    chrns._4_4_ = AddByteToTrack(track_buffer,chrns._4_4_,'N',8,'\0');
  }
  for (crc.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      crc.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 9;
      crc.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           crc.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    CRC::CRC((CRC *)local_60);
    for (local_20 = 0; local_20 < 0xc; local_20 = local_20 + 1) {
      chrns._4_4_ = AddByteWithCrc(track_buffer,chrns._4_4_,'\0',(CRC *)local_60,false);
    }
    CRC::Reset((CRC *)local_60);
    iVar3 = AddByteWithCrc(track_buffer,chrns._4_4_,0xa1,(CRC *)local_60,true);
    iVar3 = AddByteWithCrc(track_buffer,iVar3,0xa1,(CRC *)local_60,true);
    iVar3 = AddByteWithCrc(track_buffer,iVar3,0xa1,(CRC *)local_60,true);
    iVar3 = AddByteWithCrc(track_buffer,iVar3,0xfe,(CRC *)local_60,false);
    iVar3 = AddByteWithCrc(track_buffer,iVar3,cylinder,(CRC *)local_60,false);
    iVar3 = AddByteWithCrc(track_buffer,iVar3,'\0',(CRC *)local_60,false);
    iVar3 = AddByteWithCrc(track_buffer,iVar3,
                           puStack_30
                           [crc.crc_stack_.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],(CRC *)local_60
                           ,false);
    iVar3 = AddByteWithCrc(track_buffer,iVar3,'\x02',(CRC *)local_60,false);
    uVar1 = CRC::GetCRC((CRC *)local_60);
    uStack_6d = (uchar)(uVar1 >> 8);
    iVar3 = AddByteWithCrc(track_buffer,iVar3,uStack_6d,(CRC *)local_60,false);
    local_6e = (uchar)uVar1;
    chrns._4_4_ = AddByteWithCrc(track_buffer,iVar3,local_6e,(CRC *)local_60,false);
    CRC::Reset((CRC *)local_60);
    for (local_20 = 0; local_20 < 0x16; local_20 = local_20 + 1) {
      chrns._4_4_ = AddByteWithCrc(track_buffer,chrns._4_4_,'N',(CRC *)local_60,false);
    }
    for (local_20 = 0; local_20 < 0xc; local_20 = local_20 + 1) {
      chrns._4_4_ = AddByteWithCrc(track_buffer,chrns._4_4_,'\0',(CRC *)local_60,false);
    }
    CRC::Reset((CRC *)local_60);
    iVar3 = AddByteWithCrc(track_buffer,chrns._4_4_,0xa1,(CRC *)local_60,true);
    iVar3 = AddByteWithCrc(track_buffer,iVar3,0xa1,(CRC *)local_60,true);
    iVar3 = AddByteWithCrc(track_buffer,iVar3,0xa1,(CRC *)local_60,true);
    chrns._4_4_ = AddByteWithCrc(track_buffer,iVar3,0xfb,(CRC *)local_60,false);
    for (local_74 = 0; local_74 < 0x200; local_74 = local_74 + 1) {
      chrns._4_4_ = AddByteWithCrc(track_buffer,chrns._4_4_,0xe5,(CRC *)local_60,false);
    }
    uVar1 = CRC::GetCRC((CRC *)local_60);
    uStack_6d = (uchar)(uVar1 >> 8);
    iVar3 = AddByteWithoutCrc(track_buffer,chrns._4_4_,uStack_6d,false);
    local_6e = (uchar)uVar1;
    chrns._4_4_ = AddByteWithoutCrc(track_buffer,iVar3,local_6e,false);
    for (local_20 = 0; local_20 < 0x4e; local_20 = local_20 + 1) {
      chrns._4_4_ = AddByteWithoutCrc(track_buffer,chrns._4_4_,'N',false);
    }
    CRC::~CRC((CRC *)local_60);
  }
  for (; (int)chrns._4_4_ < 0x18691;
      chrns._4_4_ = AddByteWithoutCrc(track_buffer,chrns._4_4_,'N',false)) {
  }
  for (; (int)chrns._4_4_ < (int)sizeOftrack; chrns._4_4_ = chrns._4_4_ + 1) {
    track_buffer[(int)chrns._4_4_] = '\x04';
  }
  return;
}

Assistant:

void IDisk::FillTrack(unsigned char* track_buffer, const unsigned char cylinder, IDisk::DiskType type,
                      unsigned int sizeOftrack)
{
   int j;
   int load_disk_index = 0;

   unsigned char* chrns;
   switch (type)
   {
   case VENDOR:
      chrns = vendor_track;
      break;
   case DATA:
   default:
      chrns = data_track;
      break;
   }

   // Fill the track :
   //  GAP 4a : 80 octets � #4E
   for (j = 0; j < 80; j++) load_disk_index = AddByteToTrack(track_buffer, load_disk_index, 0x4E);

   //  Sync : 12 octets � #00
   for (j = 0; j < 12; j++) load_disk_index = AddByteToTrack(track_buffer, load_disk_index, 0x00);

   //  IAM : 3 octets � #C2 + 1 octet � #FC
   load_disk_index = AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = AddByteToTrack(track_buffer, load_disk_index, 0xFC);

   // GAP 1 : 50 byte with 0x4E value
   for (j = 0; j < 50; j++) load_disk_index = AddByteToTrack(track_buffer, load_disk_index, 0x4E);

   // Then, each sectors :
   for (unsigned int s = 0; s < 9; s++)
   {
      CRC crc;
      // - Sync : 12 byte, value #00
      for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x00, crc, false);

      crc.Reset();
      // - IDAM : 3 byte #A1 + 1 byte #FE
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xFE, crc);

      // Index
      // - C (identification secteur 'C' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, cylinder, crc);
      // - H (identification secteur 'H' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0, crc);
      // - R (identification secteur 'R' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, chrns[s], crc);
      // - N (identification secteur 'N' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 2, crc);

      unsigned short computed_crc = crc.GetCRC();
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, (computed_crc >> 8), crc);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, (computed_crc & 0xFF), crc);

      crc.Reset();

      // - GAP 2 (22 bytes #4E)
      for (j = 0; j < 22; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x4E, crc);

      // - Sync : 12 bytes #00
      for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x00, crc);

      crc.Reset();
      // - DATA AM : 3 bytes #A1 + 1 bytes #FB ou #F8
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, DAAM_OFF, crc);

      // With extension, CRC and GAP#3 are in the floppy
      for (unsigned int k = 0; k < 0x200; k++)
      {
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xE5, crc);
      }

      // - Crc (2 bytes) - If needed....
      computed_crc = crc.GetCRC();
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, (computed_crc >> 8));
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, (computed_crc & 0xFF));

      // - GAP #3 (x bytes)
      for (j = 0; j < 78; j++)
      {
         load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, 0x4E);
      }
   }
   // End of track
   for (; load_disk_index < 6250 * 16 - 15;)
   {
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, 0x4E);
   }

   for (; load_disk_index < static_cast<int>(sizeOftrack); load_disk_index++)
   {
      track_buffer[load_disk_index] = BIT_WEAK;
   }
}